

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O3

GLuint __thiscall gl4cts::GPUShaderFP64Test2::getMaxUniformBlockSize(GPUShaderFP64Test2 *this)

{
  uint in_EAX;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  GLint max_uniform_block_size;
  undefined8 uStack_18;
  
  uStack_18._0_4_ = in_EAX;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  uStack_18 = (ulong)(uint)uStack_18;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0x868))(0x8a30,(long)&uStack_18 + 4);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                  ,0xd9d);
  return uStack_18._4_4_;
}

Assistant:

glw::GLuint GPUShaderFP64Test2::getMaxUniformBlockSize() const
{
	const glw::Functions& gl					 = m_context.getRenderContext().getFunctions();
	glw::GLint			  max_uniform_block_size = 0;

	gl.getIntegerv(GL_MAX_UNIFORM_BLOCK_SIZE, &max_uniform_block_size);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	return max_uniform_block_size;
}